

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testQuatSlerp.cpp
# Opt level: O2

void testQuatSlerp(void)

{
  double dVar1;
  ostream *poVar2;
  long lVar3;
  int iVar4;
  int n2;
  int iVar5;
  bool bVar6;
  float fVar7;
  V3f axis2;
  V3f axis1;
  Rand48 rand;
  Quatf local_118;
  Quat<float> local_108;
  long local_f0;
  Vec3<float> local_e8;
  Vec3<float> local_d8;
  Quat<float> local_c8;
  Quatf local_b8;
  Quatf local_a8;
  Quatf local_98;
  Quatf local_88;
  Quatf local_78;
  Quat<float> local_68;
  Quatf local_58;
  long local_40;
  Rand48 local_36;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing quaternion spherical linear interpolation"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "  combinations of 90-degree rotations around x, y and z");
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar3 = 0;
  while (lVar3 != 3) {
    local_d8.x = 0.0;
    local_d8.y = 0.0;
    local_d8.z = 0.0;
    (&local_d8.x)[lVar3] = 1.0;
    local_40 = lVar3;
    for (iVar4 = 0; iVar4 != 4; iVar4 = iVar4 + 1) {
      local_118.r = 1.0;
      local_118.v.x = 0.0;
      local_118.v.y = 0.0;
      local_118.v.z = 0.0;
      Imath_3_2::Quat<float>::setAxisAngle(&local_118,&local_d8,(float)iVar4 * 1.5707964);
      lVar3 = 0;
      while (lVar3 != 3) {
        local_e8.x = 0.0;
        local_e8.y = 0.0;
        local_e8.z = 0.0;
        (&local_e8.x)[lVar3] = 1.0;
        local_f0 = lVar3;
        for (iVar5 = 0; iVar5 != 4; iVar5 = iVar5 + 1) {
          local_108.r = 1.0;
          local_108.v.x = 0.0;
          local_108.v.y = 0.0;
          local_108.v.z = 0.0;
          Imath_3_2::Quat<float>::setAxisAngle(&local_108,&local_e8,(float)iVar5 * 1.5707964);
          local_58.r = local_118.r;
          local_58.v.x = local_118.v.x;
          local_58.v.y = local_118.v.y;
          local_58.v.z = local_118.v.z;
          local_68.r = local_108.r;
          local_68.v.x = local_108.v.x;
          local_68.v.y = local_108.v.y;
          local_68.v.z = local_108.v.z;
          anon_unknown.dwarf_d2c1f::testSlerp(&local_58,&local_68);
          local_78.r = -local_118.r;
          local_78.v.x = -local_118.v.x;
          local_78.v.y = -local_118.v.y;
          local_78.v.z = -local_118.v.z;
          local_88.r = -local_108.r;
          local_88.v.x = -local_108.v.x;
          local_88.v.y = -local_108.v.y;
          local_88.v.z = -local_108.v.z;
          anon_unknown.dwarf_d2c1f::testSlerp(&local_78,&local_88);
          fVar7 = Imath_3_2::operator^(&local_118,&local_108);
          if (fVar7 < 0.99) {
            local_98.r = local_118.r;
            local_98.v.x = local_118.v.x;
            local_98.v.y = local_118.v.y;
            local_98.v.z = local_118.v.z;
            local_a8.r = -local_108.r;
            local_a8.v.x = -local_108.v.x;
            local_a8.v.y = (float)(local_108.v._4_8_ ^ 0x8000000080000000);
            local_a8.v.z = (float)((local_108.v._4_8_ ^ 0x8000000080000000) >> 0x20);
            anon_unknown.dwarf_d2c1f::testSlerp(&local_98,&local_a8);
            local_b8.r = -local_118.r;
            local_b8.v.x = -local_118.v.x;
            local_b8.v.y = -local_118.v.y;
            local_b8.v.z = -local_118.v.z;
            local_c8.r = local_108.r;
            local_c8.v.x = local_108.v.x;
            local_c8.v.y = local_108.v.y;
            local_c8.v.z = local_108.v.z;
            anon_unknown.dwarf_d2c1f::testSlerp(&local_b8,&local_c8);
          }
        }
        lVar3 = local_f0 + 1;
      }
    }
    lVar3 = local_40 + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"  random rotations");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_36._state[0] = 0xab73;
  local_36._state[1] = 0x111a;
  local_36._state[2] = 0xab73;
  iVar4 = 10000;
  while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
    Imath_3_2::hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
              ((Imath_3_2 *)&local_d8,&local_36);
    Imath_3_2::hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
              ((Imath_3_2 *)&local_e8,&local_36);
    dVar1 = Imath_3_2::Rand48::nextf(&local_36,0.0,3.141592653589793);
    local_f0 = CONCAT44(local_f0._4_4_,(float)dVar1);
    dVar1 = Imath_3_2::Rand48::nextf(&local_36,0.0,3.141592653589793);
    local_118.r = 1.0;
    local_118.v.x = 0.0;
    local_118.v.y = 0.0;
    local_118.v.z = 0.0;
    local_108.r = 1.0;
    local_108.v.x = 0.0;
    local_108.v.y = 0.0;
    local_108.v.z = 0.0;
    Imath_3_2::Quat<float>::setAxisAngle(&local_118,&local_d8,(float)local_f0);
    Imath_3_2::Quat<float>::setAxisAngle(&local_108,&local_e8,(float)dVar1);
    local_58.r = local_118.r;
    local_58.v.x = local_118.v.x;
    local_58.v.y = local_118.v.y;
    local_58.v.z = local_118.v.z;
    local_68.r = local_108.r;
    local_68.v.x = local_108.v.x;
    local_68.v.y = local_108.v.y;
    local_68.v.z = local_108.v.z;
    anon_unknown.dwarf_d2c1f::testSlerp(&local_58,&local_68);
    local_78.r = -local_118.r;
    local_78.v.x = -local_118.v.x;
    local_78.v.y = -local_118.v.y;
    local_78.v.z = -local_118.v.z;
    local_88.r = -local_108.r;
    local_88.v.x = -local_108.v.x;
    local_88.v.y = -local_108.v.y;
    local_88.v.z = -local_108.v.z;
    anon_unknown.dwarf_d2c1f::testSlerp(&local_78,&local_88);
    fVar7 = Imath_3_2::operator^(&local_118,&local_108);
    if (fVar7 < 0.99) {
      local_98.r = local_118.r;
      local_98.v.x = local_118.v.x;
      local_98.v.y = local_118.v.y;
      local_98.v.z = local_118.v.z;
      local_a8.r = -local_108.r;
      local_a8.v.x = -local_108.v.x;
      local_a8.v.y = (float)(local_108.v._4_8_ ^ 0x8000000080000000);
      local_a8.v.z = (float)((local_108.v._4_8_ ^ 0x8000000080000000) >> 0x20);
      anon_unknown.dwarf_d2c1f::testSlerp(&local_98,&local_a8);
      local_b8.r = -local_118.r;
      local_b8.v.x = -local_118.v.x;
      local_b8.v.y = -local_118.v.y;
      local_b8.v.z = -local_118.v.z;
      local_c8.r = local_108.r;
      local_c8.v.x = local_108.v.x;
      local_c8.v.y = local_108.v.y;
      local_c8.v.z = local_108.v.z;
      anon_unknown.dwarf_d2c1f::testSlerp(&local_b8,&local_c8);
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void
testQuatSlerp ()
{
    cout << "Testing quaternion spherical linear interpolation" << endl;

    specificRotations ();
    randomRotations ();

    cout << "ok\n" << endl;
}